

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

void __thiscall MockSupport::checkExpectationsOfLastActualCall(MockSupport *this)

{
  MockSupport *pMVar1;
  MockNamedValueListNode *local_18;
  MockNamedValueListNode *p;
  MockSupport *this_local;
  
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x31])();
  }
  for (local_18 = MockNamedValueList::begin(&this->data_); local_18 != (MockNamedValueListNode *)0x0
      ; local_18 = MockNamedValueListNode::next(local_18)) {
    pMVar1 = getMockSupport(this,local_18);
    if (pMVar1 != (MockSupport *)0x0) {
      pMVar1 = getMockSupport(this,local_18);
      if (pMVar1->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
        pMVar1 = getMockSupport(this,local_18);
        (*(pMVar1->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x31])();
      }
    }
  }
  return;
}

Assistant:

void MockSupport::checkExpectationsOfLastActualCall()
{
    if(lastActualFunctionCall_)
        lastActualFunctionCall_->checkExpectations();

    for(MockNamedValueListNode *p = data_.begin();p;p = p->next())
        if(getMockSupport(p) && getMockSupport(p)->lastActualFunctionCall_)
            getMockSupport(p)->lastActualFunctionCall_->checkExpectations();
}